

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

Edge * __thiscall Graph::findEdge(Graph *this,int originID,int destinyID)

{
  Vertex *pVVar1;
  Edge *in_RAX;
  Edge *pEVar2;
  Edge *pEVar3;
  
  pVVar1 = this->verticesList;
  while( true ) {
    if (pVVar1 == (Vertex *)0x0) {
      return (Edge *)0x0;
    }
    pEVar3 = pVVar1->edgesList;
    while ((pEVar2 = in_RAX, pEVar3 != (Edge *)0x0 &&
           ((pEVar3->origin->id != originID || (pEVar2 = pEVar3, pEVar3->destiny->id != destinyID)))
           )) {
      pEVar3 = pEVar3->nextEdge;
    }
    if (pEVar3 != (Edge *)0x0) break;
    pVVar1 = pVVar1->nextVertex;
    in_RAX = pEVar2;
  }
  return pEVar2;
}

Assistant:

Edge *Graph::findEdge(int originID, int destinyID){
    for(Vertex *v= get_verticesList(); v != NULL; v= v->getNext()){
        for(Edge *a= v->getEdgesList(); a != NULL; a= a->getNext()){
            if(a->getOrigin()->getID() == originID && a->getDestiny()->getID() == destinyID)
                return a;
        }
    }
    return NULL;
}